

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::ChangeClosedCurveSeam(ON_PolyCurve *this,double t)

{
  double t0;
  double *pdVar1;
  bool bVar2;
  int iVar3;
  uint count;
  int iVar4;
  int iVar5;
  uint uVar6;
  ON_Curve *pOVar7;
  long lVar8;
  double dVar9;
  double t1;
  ON_Curve *local_a0;
  ON_Interval old_dom;
  ON_Interval Segdom;
  int local_70;
  ON_Interval sdom;
  int local_58;
  ON_Curve *sright;
  ON_Curve *sleft;
  double k;
  double local_38;
  
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((char)iVar3 == '\0') {
    return false;
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this);
  iVar3 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  if (iVar3 == 1) {
    if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) {
      return false;
    }
    pOVar7 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar7 == (ON_Curve *)0x0) {
      return false;
    }
    (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar7);
    ON_Interval::TransformParameterTo(&old_dom,&sdom,t);
    iVar3 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(pOVar7);
    if ((char)iVar3 != '\0') {
      dVar9 = ON_Interval::Length(&old_dom);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (t,dVar9 + t,this);
      return (bool)(char)iVar3;
    }
    return false;
  }
  k = t;
  bVar2 = ON_Interval::Includes(&old_dom,t,false);
  dVar9 = t;
  if (!bVar2) {
    dVar9 = ON_Interval::NormalizedParameterAt(&old_dom,t);
    dVar9 = fmod(dVar9,1.0);
    dVar9 = ON_Interval::ParameterAt
                      (&old_dom,(double)(~-(ulong)(dVar9 < 0.0) & (ulong)dVar9 |
                                        (ulong)(dVar9 + 1.0) & -(ulong)(dVar9 < 0.0)));
    k = dVar9;
  }
  bVar2 = ON_Interval::Includes(&old_dom,dVar9,true);
  if (!bVar2) goto LAB_0059239c;
  count = ON_NurbsSpanIndex(2,iVar3 + 1,(this->m_t).m_a,dVar9,0,0);
  pdVar1 = (this->m_t).m_a;
  t0 = pdVar1[(int)count];
  if (dVar9 < t0) {
    return false;
  }
  t1 = pdVar1[(long)(int)count + 1];
  if (t1 <= dVar9) {
    return false;
  }
  pOVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)count];
  sleft = (ON_Curve *)0x0;
  sright = (ON_Curve *)0x0;
  if ((dVar9 != t0) || (NAN(dVar9) || NAN(t0))) {
    ON_Interval::ON_Interval(&sdom,t0,t1);
    local_38 = ON_Interval::NormalizedParameterAt(&sdom,dVar9);
    (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar7);
    Segdom.m_t[1] = t1;
    ON_Interval::ParameterAt(&Segdom,local_38);
    iVar4 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                      (pOVar7,&sleft,&sright);
    iVar5 = iVar3 + 1;
    local_a0 = pOVar7;
    if ((char)iVar4 == '\0') {
      if (0.5 < local_38) {
        uVar6 = count + 1;
        if ((int)uVar6 < iVar3) {
          pOVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(long)(int)count + 1];
          count = uVar6;
        }
        else {
          pOVar7 = (ON_Curve *)0x0;
          count = uVar6;
        }
      }
      goto LAB_00592203;
    }
  }
  else {
LAB_00592203:
    local_a0 = (ON_Curve *)0x0;
    iVar5 = iVar3;
    sright = pOVar7;
  }
  if ((int)count < iVar3) {
    (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)count] = (ON_Curve *)0x0;
    ON_SimpleArray<ON_Curve_*>::ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&sdom,(long)iVar5);
    ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)&Segdom,(long)(iVar5 + 1));
    ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)&sdom,&sright);
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)&Segdom,&k);
    ON_SimpleArray<ON_Curve_*>::Append
              ((ON_SimpleArray<ON_Curve_*> *)&sdom,iVar3 + ~count,
               (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + (long)(int)count + 1);
    ON_SimpleArray<double>::Append
              ((ON_SimpleArray<double> *)&Segdom,iVar3 + ~count,
               (this->m_t).m_a + (long)(int)count + 1);
    lVar8 = (long)local_70;
    ON_SimpleArray<ON_Curve_*>::Append
              ((ON_SimpleArray<ON_Curve_*> *)&sdom,count,
               (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a);
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)&Segdom,count,(this->m_t).m_a);
    if (sleft != (ON_Curve *)0x0) {
      ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)&sdom,&sleft);
      ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)&Segdom,(this->m_t).m_a + (int)count)
      ;
    }
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)&Segdom,&k);
    dVar9 = ON_Interval::Length(&old_dom);
    for (; lVar8 < local_70; lVar8 = lVar8 + 1) {
      *(double *)((long)Segdom.m_t[1] + lVar8 * 8) =
           *(double *)((long)Segdom.m_t[1] + lVar8 * 8) + dVar9;
    }
    memset((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a,0,
           (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity << 3);
    if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
      (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
    }
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_58,(ON_Curve **)sdom.m_t[1]
              );
    ON_SimpleArray<double>::operator=(&this->m_t,(ON_SimpleArray<double> *)&Segdom);
    if (local_a0 != (ON_Curve *)0x0) {
      (*(local_a0->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(local_a0);
    }
    ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)&Segdom);
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&sdom);
  }
LAB_0059239c:
  dVar9 = ON_Interval::Length(&old_dom);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
            (t,dVar9 + t,this);
  return true;
}

Assistant:

bool ON_PolyCurve::ChangeClosedCurveSeam( double t )
{
  bool rc = IsClosed();
  if ( rc )
  {
  	DestroyRuntimeCache();
    rc = false;
    const int old_count = Count();
    const ON_Interval old_dom = Domain();
    ON_Curve* scrv = 0;
    if ( old_count == 1 )
    {
      scrv = SegmentCurve(0);
      if ( scrv )
      {
        ON_Interval sdom = scrv->Domain();
        double s = old_dom.TransformParameterTo(sdom, t);
        rc = scrv->ChangeClosedCurveSeam(s);
        if ( rc )
          SetDomain( t, t + old_dom.Length() );
      }
    }
    else
    {
      double k = t;
      if ( !old_dom.Includes(t) )
      {
        double s = old_dom.NormalizedParameterAt(t);
        s = fmod(s,1.0);
        if ( s < 0.0 )
          s += 1.0;
        k = old_dom.ParameterAt(s);
      }
      if ( old_dom.Includes(k,true) )
      {
        int segment_index = ON_NurbsSpanIndex(2,old_count+1,m_t.Array(),k,0,0);
        scrv = m_segment[segment_index];
        if ( k < m_t[segment_index] )
          return false;
        if ( k >= m_t[segment_index+1] )
          return false;
        int new_count = (k==m_t[segment_index]) ? old_count : old_count+1;
        ON_Curve* sleft = 0;
        ON_Curve* sright = 0;
        if ( new_count > old_count )
        {
					ON_Interval subdom(m_t[segment_index], m_t[segment_index+1]);
					double nt = subdom.NormalizedParameterAt(k);
					ON_Interval Segdom = scrv->Domain();
					double segt = Segdom.ParameterAt(nt);
          rc = scrv->Split( segt, sleft, sright );

//				Greg Arden 6 May 2003. Fixes TRR#10332.  If split fails we break the
//				curve between segments and adjust the parameterization
					if(!rc){
						if(nt>.5){
							segment_index++;
							if(segment_index<old_count)
								scrv = m_segment[segment_index];		
							else
								scrv = nullptr;
						}
						new_count--;
					}
        }
        if(new_count==old_count)
        {
          sright = scrv;
          scrv = 0;
          rc = true;
        }
        if ( rc && segment_index<old_count)
        {
          m_segment[segment_index] = 0;//todo
          ON_SimpleArray<ON_Curve*> new_c(new_count);
          ON_SimpleArray<double> new_t(new_count+1);
          new_c.Append(sright);
          new_t.Append(k);
          new_c.Append( old_count-segment_index-1, m_segment.Array()+segment_index+1);
          new_t.Append( old_count-segment_index-1, m_t.Array()+segment_index+1);
          int j = new_t.Count();
          new_c.Append( segment_index, m_segment.Array() );
          new_t.Append( segment_index, m_t.Array() );
          if ( sleft )
          {
            new_c.Append(sleft);
            new_t.Append(m_t[segment_index]);
          }
          new_t.Append(k);
          double d = old_dom.Length();
          while (j < new_t.Count() )
          {
            new_t[j] += d;
            j++;
          }

          // take care when moving new_c pointers to m_segment
          // so that we don't delete any curves.
          memset( m_segment.Array(), 0, m_segment.Capacity()*sizeof( *m_segment.Array() ) );
          m_segment.SetCount(0);
          m_segment.Append( new_c.Count(), new_c.Array() );
          m_t = new_t;
          if ( scrv )
          {
            delete scrv;
            scrv = 0;
          }
        }
      }
      else
      {
        // k is already the start or  end of the existing curve
        rc = true;
      }
      if ( rc )
        SetDomain( t, t + old_dom.Length() );
    }
  }
  return rc;
}